

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hospital.cpp
# Opt level: O3

bool __thiscall
Hospital::Existence_Of_Id_For_Nurses
          (Hospital *this,vector<Nurse,_std::allocator<Nurse>_> *All_Of_Nurses,string *id)

{
  Nurse *this_00;
  size_t __n;
  bool bVar1;
  int iVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_28;
  
  this_00 = (All_Of_Nurses->super__Vector_base<Nurse,_std::allocator<Nurse>_>)._M_impl.
            super__Vector_impl_data._M_start;
  if ((All_Of_Nurses->super__Vector_base<Nurse,_std::allocator<Nurse>_>)._M_impl.
      super__Vector_impl_data._M_finish == this_00) {
    return false;
  }
  Nurse::nurse_all_ino_getter_abi_cxx11_(&local_28,this_00);
  __n = (local_28.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start)->_M_string_length;
  if (__n == id->_M_string_length) {
    if (__n == 0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_28);
    }
    else {
      iVar2 = bcmp(((local_28.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p,
                   (id->_M_dataplus)._M_p,__n);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_28);
      if (iVar2 != 0) goto LAB_00120447;
    }
    bVar1 = true;
  }
  else {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_28);
LAB_00120447:
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool Hospital :: Existence_Of_Id_For_Nurses(vector<Nurse> All_Of_Nurses , string id){
    for (int i = 0; i <All_Of_Nurses.size() ; ++i) {
        if (All_Of_Nurses[i].nurse_all_ino_getter()[0] == id)
            return true;
        break;

    }
    return false;
}